

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O0

void * msocket_ary_shift(msocket_ary_t *self)

{
  void **ppvVar1;
  void *pElem;
  msocket_ary_t *self_local;
  
  if (self == (msocket_ary_t *)0x0) {
    __assert_fail("(self != 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/msocket/src/msocket_adt.c"
                  ,0xde,"void *msocket_ary_shift(msocket_ary_t *)");
  }
  if (self->s32CurLen == 0) {
    self_local = (msocket_ary_t *)0x0;
  }
  else {
    ppvVar1 = self->pFirst;
    self->pFirst = ppvVar1 + 1;
    self_local = (msocket_ary_t *)*ppvVar1;
    self->s32CurLen = self->s32CurLen + -1;
    if (self->s32CurLen == 0) {
      self->pFirst = self->ppAlloc;
    }
  }
  return self_local;
}

Assistant:

void* msocket_ary_shift(msocket_ary_t* self) {
   void* pElem;
   assert((self != 0));
   if (self->s32CurLen == 0) {
      return (void*)0;
   }
   pElem = *(self->pFirst++); //move pFirst forward by 1
   self->s32CurLen--; //reduce array length by 1
   if (self->s32CurLen == 0) {
      //reallign pFirst with pAlloc when buffer becomes empty
      self->pFirst = self->ppAlloc;
   }
   return pElem;
}